

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O0

bool __thiscall CArmInstruction::Validate(CArmInstruction *this,ValidateState *state)

{
  byte bVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  uint uVar5;
  int *args;
  CArmInstruction *args_00;
  uint uVar6;
  uint local_a0;
  uint check;
  uint uStack_7c;
  bool needsShift;
  int temp_1;
  int immediate;
  uint encoding;
  int temp;
  undefined1 local_60 [8];
  ExpressionValue value;
  uint local_28;
  uint uStack_24;
  bool memoryAdvanced;
  int num;
  int mode;
  ValidateState *state_local;
  CArmInstruction *this_local;
  
  _num = state;
  state_local = (ValidateState *)this;
  args = (int *)FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = (int64_t)args;
  (this->Vars).Opcode.UseNewEncoding = false;
  (this->Vars).Opcode.UseNewType = false;
  if ((this->RamPos & 3U) != 0) {
    Logger::queueError<>(Warning,"Opcode not word aligned");
  }
  if ((((this->Vars).Shift.UseShift & 1U) != 0) && (((this->Vars).Shift.ShiftByRegister & 1U) == 0))
  {
    bVar2 = Expression::evaluateInteger<int>
                      (&(this->Vars).Shift.ShiftExpression,&(this->Vars).Shift.ShiftAmount);
    if (!bVar2) {
      Logger::queueError<>(Error,"Invalid expression");
      this_local._7_1_ = 0;
      goto LAB_001c3b41;
    }
    bVar1 = (this->Vars).Shift.Type;
    uStack_24 = (uint)bVar1;
    local_28 = (this->Vars).Shift.ShiftAmount;
    if ((local_28 == 0) && (uStack_24 == 1)) {
      uStack_24 = 0;
    }
    else if ((local_28 == 0) && (uStack_24 == 2)) {
      uStack_24 = 0;
    }
    else if ((local_28 == 0) && (uStack_24 == 3)) {
      uStack_24 = 0;
    }
    else if ((local_28 == 0x20) && (uStack_24 == 1)) {
      local_28 = 0;
    }
    else if ((local_28 == 0x20) && (uStack_24 == 2)) {
      local_28 = 0;
    }
    else {
      if ((local_28 == 0x20) && (uStack_24 == 0)) {
        Logger::queueError<int>((Logger *)0x1,0x227923,(char *)&local_28,(int *)(ulong)bVar1);
        this_local._7_1_ = 0;
        goto LAB_001c3b41;
      }
      if (uStack_24 == 4) {
        if (local_28 != 1) {
          Logger::queueError<>(Error,"Invalid shift mode");
          this_local._7_1_ = 0;
          goto LAB_001c3b41;
        }
        uStack_24 = 3;
        local_28 = 0;
      }
    }
    if ((0x20 < (int)local_28) || ((int)local_28 < 0)) {
      Logger::queueError<int>((Logger *)0x1,0x227923,(char *)&local_28,(int *)(ulong)bVar1);
      this_local._7_1_ = 0;
      goto LAB_001c3b41;
    }
    (this->Vars).Shift.FinalType = (uchar)uStack_24;
    args = (int *)(ulong)local_28;
    (this->Vars).Shift.FinalShiftAmount = local_28;
    (this->Vars).Shift.UseFinal = true;
  }
  if (((this->Opcode).flags & 0x400000U) != 0) {
    bVar2 = Expression::evaluateInteger<int>
                      (&(this->Vars).CopData.CpopExpression,&(this->Vars).CopData.Cpop);
    if (!bVar2) {
      Logger::queueError<>(Error,"Invalid expression");
      this_local._7_1_ = 0;
      goto LAB_001c3b41;
    }
    if (0xf < (this->Vars).CopData.Cpop) {
      Logger::queueError<int>((Logger *)0x1,0x227957,(char *)&(this->Vars).CopData.Cpop,args);
      this_local._7_1_ = 0;
      goto LAB_001c3b41;
    }
  }
  if (((this->Opcode).flags & 0x800000U) != 0) {
    bVar2 = Expression::evaluateInteger<int>
                      (&(this->Vars).CopData.CpinfExpression,&(this->Vars).CopData.Cpinf);
    if (!bVar2) {
      Logger::queueError<>(Error,"Invalid expression");
      this_local._7_1_ = 0;
      goto LAB_001c3b41;
    }
    if (7 < (this->Vars).CopData.Cpinf) {
      Logger::queueError<int>((Logger *)0x1,0x227972,(char *)&(this->Vars).CopData.Cpinf,args);
      this_local._7_1_ = 0;
      goto LAB_001c3b41;
    }
  }
  if (((this->Opcode).flags & 0x1000000U) != 0) {
    ArmRegisterValue::operator=(&(this->Vars).rn,&(this->Vars).rd);
  }
  if (((this->Opcode).flags & 0x2000000U) != 0) {
    ArmRegisterValue::operator=(&(this->Vars).rm,&(this->Vars).rd);
  }
  if ((((this->Opcode).flags & 0x8000000U) != 0) && (((this->Vars).rd.num & 1U) != 0)) {
    Logger::queueError<>(Error,"rd must be even");
    this_local._7_1_ = 0;
    goto LAB_001c3b41;
  }
  value.strValue._value.field_2._M_local_buf[0xf] = '\0';
  if (((this->Opcode).flags & 0x20U) != 0) {
    Expression::evaluate((ExpressionValue *)local_60,&(this->Vars).ImmediateExpression);
    if (local_60._0_4_ != Integer) {
      if (local_60._0_4_ == Float) {
        if ((((this->Opcode).flags & 0x8000U) != 0) || (((this->Opcode).flags & 0x10000U) != 0)) {
          iVar3 = getFloatBits((float)(double)value._0_8_);
          (this->Vars).Immediate = iVar3;
          goto LAB_001c33f8;
        }
        Logger::queueError<>(Error,"Invalid expression type");
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      else {
        Logger::queueError<>(Error,"Invalid expression type");
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      goto LAB_001c3b0d;
    }
    (this->Vars).Immediate = value.type;
LAB_001c33f8:
    (this->Vars).OriginalImmediate = (this->Vars).Immediate;
    (this->Vars).negative = false;
    FileManager::advanceMemory(g_fileManager,4);
    value.strValue._value.field_2._M_local_buf[0xf] = '\x01';
    if (((this->Opcode).flags & 0x8000U) == 0) {
      if (((this->Opcode).flags & 0x10000U) != 0) {
        iVar4 = getShiftedImmediate(this,(this->Vars).Immediate,&(this->Vars).Shift.ShiftAmount);
        if (iVar4 == -1) {
          iVar4 = getShiftedImmediate(this,(this->Vars).Immediate ^ 0xffffffff,
                                      &(this->Vars).Shift.ShiftAmount);
          if (iVar4 == -1) {
            CArmArchitecture::addPoolValue
                      (&Arm,&this->super_ArmOpcodeCommand,(this->Vars).Immediate);
          }
          else {
            (this->Vars).Opcode.NewEncoding = 0x3e00000;
            (this->Vars).Opcode.UseNewEncoding = true;
            (this->Vars).Opcode.NewType = '\x02';
            (this->Vars).Opcode.UseNewType = true;
            (this->Vars).Immediate = iVar4;
          }
        }
        else {
          (this->Vars).Opcode.NewEncoding = 0x3a00000;
          (this->Vars).Opcode.UseNewEncoding = true;
          (this->Vars).Opcode.NewType = '\x02';
          (this->Vars).Opcode.UseNewType = true;
          (this->Vars).Immediate = iVar4;
        }
        goto LAB_001c3a35;
      }
      if (((this->Opcode).flags & 0x40000U) == 0) {
        if (((this->Opcode).flags & 0x80000U) == 0) {
          if (((this->Opcode).flags & 0x200000U) == 0) {
            if ((((this->Opcode).flags & 0x20000U) != 0) && ((this->Vars).Immediate < 0)) {
              iVar4 = (this->Vars).Immediate;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              (this->Vars).Immediate = iVar4;
              (this->Vars).negative = true;
            }
          }
          else {
            bVar2 = true;
            if (this->arch != AARCH_GBA) {
              bVar2 = this->arch == AARCH_NDS;
            }
            if ((bVar2) && ((this->Vars).Immediate < 0xff)) {
              (this->Vars).Immediate = (this->Vars).Immediate << 0x10;
              (this->Vars).OriginalImmediate = (this->Vars).Immediate;
            }
          }
        }
        else {
          (this->Vars).Immediate = ((this->Vars).Immediate - (int)this->RamPos) + -8;
          iVar4 = (this->Vars).Immediate;
          if (iVar4 < 1) {
            iVar4 = -iVar4;
          }
          uVar6 = 1 << ((byte)(this->Vars).ImmediateBitLen & 0x1f);
          if ((int)uVar6 <= iVar4) {
            Logger::queueError<int>
                      ((Logger *)0x1,0x2279d4,(char *)&(this->Vars).OriginalImmediate,
                       (int *)(ulong)uVar6);
            this_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_001c3b0d;
          }
        }
        goto LAB_001c3a35;
      }
      if (((this->Opcode).flags & 0x80U) == 0) {
        if (((this->Vars).Immediate & 3U) == 0) goto LAB_001c3857;
        Logger::queueError<>(Error,"Branch target must be word aligned");
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      else if (((this->Vars).Immediate & 1U) == 0) {
LAB_001c3857:
        (this->Vars).Immediate = ((this->Vars).Immediate - (int)this->RamPos) + -8;
        uVar6 = (this->Vars).Immediate;
        uVar5 = uVar6;
        if ((int)uVar6 < 1) {
          uVar5 = -uVar6;
        }
        if ((int)uVar5 < 0x2000000) goto LAB_001c3a35;
        Logger::queueError<int>
                  ((Logger *)0x1,0x22702e,(char *)&(this->Vars).OriginalImmediate,
                   (int *)(ulong)-uVar6);
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      else {
        Logger::queueError<>(Error,"Branch target must be halfword aligned");
        this_local._7_1_ = 0;
        bVar2 = true;
      }
    }
    else {
      (this->Vars).negative = false;
      if ((((this->Opcode).flags & 0x20000U) != 0) && ((this->Vars).Immediate < 0)) {
        iVar4 = (this->Vars).Immediate;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        (this->Vars).Immediate = iVar4;
        (this->Vars).negative = true;
      }
      args_00 = this;
      if (((this->Opcode).flags & 0x100000000U) != 0) {
        args_00 = (CArmInstruction *)
                  ((long)(this->Vars).Immediate - (this->RamPos + 8U & 0xfffffffffffffffc));
        (this->Vars).Immediate = (int)args_00;
        if ((this->Vars).Immediate < 0) {
          (this->Vars).Opcode.NewEncoding = (this->Opcode).encoding ^ 0xc00000;
          (this->Vars).Opcode.UseNewEncoding = true;
          uVar6 = (this->Vars).Immediate;
          if ((int)uVar6 < 1) {
            uVar6 = -uVar6;
          }
          args_00 = (CArmInstruction *)(ulong)uVar6;
          (this->Vars).Immediate = uVar6;
        }
      }
      immediate = getShiftedImmediate(this,(this->Vars).Immediate,&(this->Vars).Shift.ShiftAmount);
      if (immediate == -1) {
        if (((this->Opcode).flags & 0x10000000U) != 0) {
          temp_1 = (this->Opcode).encoding;
          uStack_7c = (this->Vars).Immediate;
          args_00 = (CArmInstruction *)(ulong)uStack_7c;
          if (((this->Opcode).flags & 0x20000000U) == 0) {
            if (((this->Opcode).flags & 0x40000000U) == 0) {
              if (((this->Opcode).flags & 0x80000000U) == 0) {
                args_00 = this;
                if (((this->Opcode).flags & 0x200000000U) != 0) {
                  temp_1 = temp_1 ^ 0xc00000;
                  uStack_7c = -uStack_7c;
                }
              }
              else {
                temp_1 = temp_1 ^ 0x200000;
                uStack_7c = -uStack_7c;
                args_00 = this;
              }
            }
            else {
              temp_1 = temp_1 ^ 0x1c00000;
              uStack_7c = uStack_7c ^ 0xffffffff;
            }
          }
          else {
            temp_1 = temp_1 ^ 0x400000;
            uStack_7c = uStack_7c ^ 0xffffffff;
          }
          immediate = getShiftedImmediate(this,uStack_7c,&(this->Vars).Shift.ShiftAmount);
          if (immediate != -1) {
            args_00 = (CArmInstruction *)(ulong)(uint)temp_1;
            (this->Vars).Opcode.NewEncoding = temp_1;
            (this->Vars).Opcode.UseNewEncoding = true;
          }
        }
        if (immediate == -1) {
          Logger::queueError<int>
                    ((Logger *)0x1,0x2279b5,(char *)&(this->Vars).OriginalImmediate,(int *)args_00);
          this_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_001c3b0d;
        }
      }
      (this->Vars).Immediate = immediate;
LAB_001c3a35:
      if (((this->Vars).ImmediateBitLen != 0x20) && (((this->Opcode).flags & 0x80000U) == 0)) {
        if (((this->Opcode).flags & 0x20000U) == 0) {
          local_a0 = (this->Vars).Immediate;
        }
        else {
          local_a0 = (this->Vars).Immediate;
          if ((int)local_a0 < 1) {
            local_a0 = -local_a0;
          }
        }
        uVar6 = 1 << ((byte)(this->Vars).ImmediateBitLen & 0x1f);
        if (uVar6 <= local_a0) {
          Logger::queueError<int>
                    ((Logger *)0x1,0x2279f2,(char *)&(this->Vars).OriginalImmediate,
                     (int *)(ulong)uVar6);
          this_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_001c3b0d;
        }
      }
      bVar2 = false;
    }
LAB_001c3b0d:
    ExpressionValue::~ExpressionValue((ExpressionValue *)local_60);
    if (bVar2) goto LAB_001c3b41;
  }
  if ((value.strValue._value.field_2._M_local_buf[0xf] & 1U) == 0) {
    FileManager::advanceMemory(g_fileManager,4);
  }
  this_local._7_1_ = 0;
LAB_001c3b41:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CArmInstruction::Validate(const ValidateState &state)
{
	RamPos = g_fileManager->getVirtualAddress();

	Vars.Opcode.UseNewEncoding = false;
	Vars.Opcode.UseNewType = false;


	if (RamPos & 3)
	{
		Logger::queueError(Logger::Warning, "Opcode not word aligned");
	}

	if (Vars.Shift.UseShift && !Vars.Shift.ShiftByRegister)
	{
		if (!Vars.Shift.ShiftExpression.evaluateInteger(Vars.Shift.ShiftAmount))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		int mode = Vars.Shift.Type;
		int num = Vars.Shift.ShiftAmount;

		if (num == 0 && mode == ARM_SHIFT_LSR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ASR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ROR) mode = ARM_SHIFT_LSL;
		else if (num == 32 && mode == ARM_SHIFT_LSR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_ASR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_LSL)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		} else if (mode == ARM_SHIFT_RRX)
		{
			if (num != 1)
			{
				Logger::queueError(Logger::Error, "Invalid shift mode");
				return false;
			}
			mode = ARM_SHIFT_ROR;
			num = 0;
		}

		if (num > 32 || num < 0)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		}

		Vars.Shift.FinalType = mode;
		Vars.Shift.FinalShiftAmount = num;
		Vars.Shift.UseFinal = true;
	}

	if (Opcode.flags & ARM_COPOP)
	{
		if (!Vars.CopData.CpopExpression.evaluateInteger(Vars.CopData.Cpop))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpop > 15)
		{
			Logger::queueError(Logger::Error, "CP Opc number %02X too big",Vars.CopData.Cpop);
			return false;
		}
	}

	if (Opcode.flags & ARM_COPINF)
	{
		if (!Vars.CopData.CpinfExpression.evaluateInteger(Vars.CopData.Cpinf))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpinf > 7)
		{
			Logger::queueError(Logger::Error, "CP Inf number %02X too big",Vars.CopData.Cpinf);
			return false;
		}
	}

	if (Opcode.flags & ARM_DN)
	{
		Vars.rn = Vars.rd;
	}

	if (Opcode.flags & ARM_DM)
	{
		Vars.rm = Vars.rd;
	}

	if (Opcode.flags & ARM_RDEVEN)
	{
		if (Vars.rd.num & 1)
		{
			Logger::queueError(Logger::Error, "rd must be even");
			return false;
		}
	}

	bool memoryAdvanced = false;
	if (Opcode.flags & ARM_IMMEDIATE)
	{
		ExpressionValue value = Vars.ImmediateExpression.evaluate();

		switch (value.type)
		{
		case ExpressionValueType::Integer:
			Vars.Immediate = (int) value.intValue;
			break;
		case ExpressionValueType::Float:
			if (!(Opcode.flags & ARM_SHIFT) && !(Opcode.flags & ARM_POOL))
			{
				Logger::queueError(Logger::Error, "Invalid expression type");
				return false;
			}

			Vars.Immediate = (int) getFloatBits((float)value.floatValue);
			break;
		default:
			Logger::queueError(Logger::Error, "Invalid expression type");
			return false;
		}

		Vars.OriginalImmediate = Vars.Immediate;
		Vars.negative = false;
		
		g_fileManager->advanceMemory(4);
		memoryAdvanced = true;

		if (Opcode.flags & ARM_SHIFT)	// shifted immediate, eg 4000h
		{
			int temp;
			Vars.negative = false;
			if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
			{
				Vars.Immediate = abs(Vars.Immediate);
				Vars.negative = true;
			}

			if (Opcode.flags & ARM_PCR)
			{
				Vars.Immediate = Vars.Immediate - ((RamPos+8) & ~3);
				if (Vars.Immediate < 0)
				{
					Vars.Opcode.NewEncoding = Opcode.encoding ^ 0xC00000;
					Vars.Opcode.UseNewEncoding = true;
					Vars.Immediate = abs(Vars.Immediate);
				}
			}

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) == -1)
			{
				// mov/mvn -> mvn/mov
				if ((Opcode.flags & ARM_OPTIMIZE))
				{
					auto encoding = Opcode.encoding;
					auto immediate = Vars.Immediate;

					if (Opcode.flags & ARM_OPMOVMVN)
					{
						encoding ^= 0x0400000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPANDBIC)
					{
						encoding ^= 0x1C00000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPCMPCMN)
					{
						encoding ^= 0x0200000;
						immediate = 0-immediate;
					}
					else if (Opcode.flags & ARM_OPADDSUB)
					{
						encoding ^= 0x0C00000;
						immediate = 0-immediate;
					}

					temp = getShiftedImmediate(immediate, Vars.Shift.ShiftAmount);
					if (temp != -1)
					{
						Vars.Opcode.NewEncoding = encoding;
						Vars.Opcode.UseNewEncoding = true;
					}
				}
				if (temp == -1)
				{
					// If we get here then the instruction did not contain a shifted immediate
					// and we failed to optimize into another instruction
					Logger::queueError(Logger::Error, "Invalid shifted immediate 0x%X", Vars.OriginalImmediate);
					return false;
				}
			}
			Vars.Immediate = temp;
		} else if (Opcode.flags & ARM_POOL)
		{
			int temp;

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) != -1)
			{
				// interpete ldr= as mov
				Vars.Opcode.NewEncoding = 0x03A00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else if ((temp = getShiftedImmediate(~Vars.Immediate,Vars.Shift.ShiftAmount)) != -1) 
			{
				// interprete ldr= as mvn
				Vars.Opcode.NewEncoding = 0x03E00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else {
				Arm.addPoolValue(this,Vars.Immediate);
			}
		} else if (Opcode.flags & ARM_BRANCH)
		{
			if (Opcode.flags & ARM_HALFWORD)
			{
				if (Vars.Immediate & 1)
				{
					Logger::queueError(Logger::Error, "Branch target must be halfword aligned");
					return false;
				}
			} else {
				if (Vars.Immediate & 3)
				{
					Logger::queueError(Logger::Error, "Branch target must be word aligned");
					return false;
				}
			}

			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= 0x2000000)
			{
				Logger::queueError(Logger::Error, "Branch target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_ABSIMM)	// ldr r0,[I]
		{
			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= (1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Load target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_SWI)	// it's an interrupt, may need to shift it
		{
			bool needsShift = arch == AARCH_GBA || arch == AARCH_NDS;
			if (needsShift && Vars.Immediate < 0xFF)
			{
				Vars.Immediate <<= 16;
				Vars.OriginalImmediate = Vars.Immediate;
			}
		} else if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
		{
			Vars.Immediate = abs(Vars.Immediate);
			Vars.negative = true;
		}

		if (Vars.ImmediateBitLen != 32 && !(Opcode.flags & ARM_ABSIMM))
		{
			unsigned int check = Opcode.flags & ARM_ABS ? abs(Vars.Immediate) : Vars.Immediate;
			if (check >= (unsigned int)(1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Immediate value %X out of range",Vars.OriginalImmediate);
				return false;
			}
		}
	}
	
	if (!memoryAdvanced)
		g_fileManager->advanceMemory(4);

	return false;
}